

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O0

ON_Sun * __thiscall ON_Sun::operator=(ON_Sun *this,ON_Sun *sun)

{
  bool bVar1;
  int minutes;
  double dVar2;
  double local_30;
  double h;
  int local_20;
  int d;
  int m;
  int y;
  ON_Sun *sun_local;
  ON_Sun *this_local;
  
  if (this != sun) {
    _m = sun;
    sun_local = this;
    bVar1 = EnableOn(sun);
    SetEnableOn(this,bVar1);
    bVar1 = EnableAllowed(_m);
    SetEnableAllowed(this,bVar1);
    bVar1 = EnableOn(_m);
    SetEnableOn(this,bVar1);
    bVar1 = ManualControlAllowed(_m);
    SetManualControlAllowed(this,bVar1);
    bVar1 = ManualControlOn(_m);
    SetManualControlOn(this,bVar1);
    dVar2 = North(_m);
    SetNorth(this,dVar2);
    bVar1 = DaylightSavingOn(_m);
    SetDaylightSavingOn(this,bVar1);
    minutes = DaylightSavingMinutes(_m);
    SetDaylightSavingMinutes(this,minutes);
    dVar2 = Azimuth(_m);
    SetAzimuth(this,dVar2);
    dVar2 = Altitude(_m);
    SetAltitude(this,dVar2);
    dVar2 = Latitude(_m);
    SetLatitude(this,dVar2);
    dVar2 = Longitude(_m);
    SetLongitude(this,dVar2);
    dVar2 = TimeZone(_m);
    SetTimeZone(this,dVar2);
    dVar2 = Intensity(_m);
    SetIntensity(this,dVar2);
    dVar2 = ShadowIntensity(_m);
    SetShadowIntensity(this,dVar2);
    d = 0;
    local_20 = 0;
    h._4_4_ = 0;
    local_30 = 0.0;
    LocalDateTime(_m,&d,&local_20,(int *)((long)&h + 4),&local_30);
    SetLocalDateTime(this,d,local_20,h._4_4_,local_30);
    this->_impl->_azimuth = _m->_impl->_azimuth;
    this->_impl->_altitude = _m->_impl->_altitude;
    this->_impl->_calc_dirty = (bool)(_m->_impl->_calc_dirty & 1);
  }
  return this;
}

Assistant:

const ON_Sun& ON_Sun::operator = (const ON_Sun& sun)
{
  if (this != &sun)
  {
    // When copying the object, we need to directly copy the underlying XML. So we can't allow
    // virtual overrides to execute because they might hide the real values we want to copy.
    ON_Sun::SetEnableOn             (sun.ON_Sun::EnableOn());
    ON_Sun::SetEnableAllowed        (sun.ON_Sun::EnableAllowed());
    ON_Sun::SetEnableOn             (sun.ON_Sun::EnableOn());
    ON_Sun::SetManualControlAllowed (sun.ON_Sun::ManualControlAllowed());
    ON_Sun::SetManualControlOn      (sun.ON_Sun::ManualControlOn());
    ON_Sun::SetNorth                (sun.ON_Sun::North());
    ON_Sun::SetDaylightSavingOn     (sun.ON_Sun::DaylightSavingOn());
    ON_Sun::SetDaylightSavingMinutes(sun.ON_Sun::DaylightSavingMinutes());
    ON_Sun::SetAzimuth              (sun.ON_Sun::Azimuth());
    ON_Sun::SetAltitude             (sun.ON_Sun::Altitude());
    ON_Sun::SetLatitude             (sun.ON_Sun::Latitude());
    ON_Sun::SetLongitude            (sun.ON_Sun::Longitude());
    ON_Sun::SetTimeZone             (sun.ON_Sun::TimeZone());
    ON_Sun::SetIntensity            (sun.ON_Sun::Intensity());
    ON_Sun::SetShadowIntensity      (sun.ON_Sun::ShadowIntensity());

    int y = 0, m = 0, d = 0; double h = 0.0;
    sun.ON_Sun::LocalDateTime(y, m, d, h);
    ON_Sun::SetLocalDateTime(y, m, d, h);

    _impl->_azimuth    = sun._impl->_azimuth;
    _impl->_altitude   = sun._impl->_altitude;
    _impl->_calc_dirty = sun._impl->_calc_dirty;
  }

  return *this;
}